

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O1

void __thiscall
GLRState::GLRState(GLRState *this,string *name,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *productions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar5;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar4;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->accepting = false;
  p_Var3 = &(this->prodEstablished)._M_t._M_impl.super__Rb_tree_header;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header
  ;
  (this->prodEstablished)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->productions)._M_t._M_impl.super__Rb_tree_header,
             &(productions->_M_t)._M_impl.super__Rb_tree_header);
  p_Var3 = &(this->statesTo)._M_t._M_impl.super__Rb_tree_header;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->statesTo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

GLRState::GLRState(std::string name, std::set<Production *> productions) : name(std::move(name)),
                                                                           productions(std::move(productions)),
                                                                           accepting(false) {
//    prodEstablished = productions.size();
}